

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

ChLinkMask * __thiscall chrono::ChLinkMask::operator=(ChLinkMask *this,ChLinkMask *other)

{
  int iVar1;
  ChConstraintTwoBodies *pCVar2;
  int i;
  long lVar3;
  
  if (this != other) {
    iVar1 = other->nconstr;
    this->nconstr = iVar1;
    std::vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
    resize(&this->constraints,(long)iVar1);
    for (lVar3 = 0; lVar3 < this->nconstr; lVar3 = lVar3 + 1) {
      pCVar2 = (ChConstraintTwoBodies *)
               (**(code **)((long)((other->constraints).
                                   super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar3]->
                                  super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint +
                           0x10))();
      (this->constraints).
      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar3] = pCVar2;
    }
  }
  return this;
}

Assistant:

ChLinkMask& ChLinkMask::operator=(const ChLinkMask& other) {
    if (this == &other)
        return *this;

    nconstr = other.nconstr;
    constraints.resize(nconstr);
    for (int i = 0; i < nconstr; i++) {
        constraints[i] = other.constraints[i]->Clone();
    }

    return *this;
}